

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

void __thiscall gutil::Properties::putValue<long>(Properties *this,char *key,long *value)

{
  long *in_RDX;
  string *in_RSI;
  char *in_RDI;
  ostringstream out;
  string local_1c0 [48];
  ostringstream local_190 [376];
  long *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<((ostream *)local_190,*local_18);
  std::__cxx11::ostringstream::str();
  gutil::Properties::putString(in_RDI,local_10);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void putValue(const char *key, const T &value)
    {
      std::ostringstream out;
      out << value;
      putString(key, out.str());
    }